

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::update_list(torrent *this,torrent_list_index_t list,bool in)

{
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  value_type *this_00;
  undefined4 extraout_var;
  char *pcVar5;
  vector<torrent_*> *v;
  link *l;
  bool in_local;
  torrent *this_local;
  torrent_list_index_t list_local;
  
  this_00 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
            ::operator[](&this->m_links,
                         (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)list.m_val);
  psVar1 = (this->super_torrent_hot_members).m_ses;
  iVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x3c])
                    (psVar1,(ulong)(uint)list.m_val);
  if (in) {
    bVar2 = link::in_list(this_00);
    if (bVar2) {
      return;
    }
    link::insert<libtorrent::aux::torrent>
              (this_00,(vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var,iVar3),this);
  }
  else {
    bVar2 = link::in_list(this_00);
    if (!bVar2) {
      return;
    }
    link::unlink<libtorrent::aux::torrent>
              (this_00,(vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var,iVar3),list);
  }
  uVar4 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar4 & 1) != 0) {
    pcVar5 = anon_unknown_135::list_name(list);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** UPDATE LIST [ %s : %d ]",pcVar5,(ulong)in);
  }
  return;
}

Assistant:

void torrent::update_list(torrent_list_index_t const list, bool in)
	{
		link& l = m_links[list];
		aux::vector<torrent*>& v = m_ses.torrent_list(list);

		if (in)
		{
			if (l.in_list()) return;
			l.insert(v, this);
		}
		else
		{
			if (!l.in_list()) return;
			l.unlink(v, list);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** UPDATE LIST [ %s : %d ]", list_name(list), int(in));
#endif
	}